

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

Result<void> * init::SetLoggingLevel(ArgsManager *args)

{
  string_view level_str_00;
  string_view str;
  string_view level_str_01;
  string_view category_str;
  byte bVar1;
  bool bVar2;
  reference pbVar3;
  size_type sVar4;
  Logger *this;
  size_type sVar5;
  bilingual_str *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *toks;
  string *level_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  iterator __end2;
  iterator __begin2;
  bilingual_str *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  char in_stack_fffffffffffffce7;
  Logger *in_stack_fffffffffffffce8;
  reference in_stack_fffffffffffffcf0;
  Logger *in_stack_fffffffffffffcf8;
  ArgsManager *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  Logger *in_stack_fffffffffffffd10;
  allocator<char> *in_stack_fffffffffffffd18;
  Logger *in_stack_fffffffffffffd20;
  ConstevalStringLiteral in_stack_fffffffffffffd28;
  string *strArg;
  undefined7 in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  char *args_1;
  __sv_type in_stack_fffffffffffffd80;
  int local_224;
  string local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a9 [9];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = local_1a9;
  args_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28.lit,(char *)in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18);
  bVar1 = ArgsManager::IsArgSet(in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->original);
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  if ((bVar1 & 1) != 0) {
    strArg = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd28.lit,(char *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18);
    ArgsManager::GetArgs((ArgsManager *)CONCAT17(bVar1,in_stack_fffffffffffffd50),strArg);
    std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->original);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    while (bVar2 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffce8,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffcd8);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffce8,in_stack_fffffffffffffce7,
                            (size_type)in_stack_fffffffffffffcd8);
      if (sVar4 == 0xffffffffffffffff) {
        LogInstance();
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf8);
        level_str_00._M_len._7_1_ = in_stack_fffffffffffffd0f;
        level_str_00._M_len._0_7_ = in_stack_fffffffffffffd08;
        level_str_00._M_str = (char *)in_stack_fffffffffffffd10;
        bVar2 = BCLog::Logger::SetLogLevel(in_stack_fffffffffffffce8,level_str_00);
        if (!bVar2) {
          ::_((ConstevalStringLiteral)local_88);
          this = LogInstance();
          BCLog::Logger::LogLevelsString_abi_cxx11_(this);
          tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                    (in_RSI,(char (*) [10])args_00,in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffd50));
          util::Result<void>::Result
                    ((Result<void> *)in_stack_fffffffffffffce8,
                     (Error *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
          util::Error::~Error((Error *)in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->original);
          bilingual_str::~bilingual_str(in_stack_fffffffffffffcd8);
          local_224 = 1;
          goto LAB_01954d7f;
        }
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf8);
        str._M_str = (char *)in_stack_fffffffffffffd18;
        str._M_len = (size_t)in_stack_fffffffffffffd10;
        util::SplitString_abi_cxx11_(str,(char)((ulong)in_stack_fffffffffffffcf0 >> 0x38));
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcd8);
        if (sVar5 == 2) {
          in_stack_fffffffffffffd10 = LogInstance();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffce8,
                       CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffce8,
                       CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
          in_stack_fffffffffffffd80 =
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcf8);
          category_str._M_str = (char *)args_00;
          category_str._M_len = (size_t)in_RDI;
          level_str_01._M_str._0_7_ = in_stack_fffffffffffffd50;
          level_str_01._M_len = (size_t)strArg;
          level_str_01._M_str._7_1_ = bVar1;
          in_stack_fffffffffffffd0f =
               BCLog::Logger::SetCategoryLogLevel
                         ((Logger *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                          category_str,level_str_01);
          if (!(bool)in_stack_fffffffffffffd0f) goto LAB_01954b71;
          local_224 = 0;
        }
        else {
LAB_01954b71:
          args_1 = 
          "Unsupported category-specific logging level %1$s=%2$s. Expected %1$s=<category>:<loglevel>. Valid categories: %3$s. Valid loglevels: %4$s."
          ;
          ::_(in_stack_fffffffffffffd28);
          in_stack_fffffffffffffcf8 = LogInstance();
          BCLog::Logger::LogCategoriesString_abi_cxx11_
                    ((Logger *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
          in_stack_fffffffffffffce8 = LogInstance();
          BCLog::Logger::LogLevelsString_abi_cxx11_(in_stack_fffffffffffffd20);
          tinyformat::
          format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((bilingual_str *)in_stack_fffffffffffffd80._M_str,
                     (char (*) [10])in_stack_fffffffffffffd80._M_len,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                     args_2,&in_RSI->original);
          util::Result<void>::Result
                    ((Result<void> *)in_stack_fffffffffffffce8,
                     (Error *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
          util::Error::~Error((Error *)in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->original);
          std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->original);
          bilingual_str::~bilingual_str(in_stack_fffffffffffffcd8);
          local_224 = 1;
          in_stack_fffffffffffffcf0 = pbVar3;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffce8);
        if (local_224 != 0) goto LAB_01954d7f;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffcd8);
    }
    local_224 = 2;
LAB_01954d7f:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffce8);
    if (local_224 == 1) goto LAB_01954dba;
  }
  util::Result<void>::Result
            ((Result<void> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
LAB_01954dba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Result<void> *)args_00;
}

Assistant:

util::Result<void> SetLoggingLevel(const ArgsManager& args)
{
    if (args.IsArgSet("-loglevel")) {
        for (const std::string& level_str : args.GetArgs("-loglevel")) {
            if (level_str.find_first_of(':', 3) == std::string::npos) {
                // user passed a global log level, i.e. -loglevel=<level>
                if (!LogInstance().SetLogLevel(level_str)) {
                    return util::Error{strprintf(_("Unsupported global logging level %s=%s. Valid values: %s."), "-loglevel", level_str, LogInstance().LogLevelsString())};
                }
            } else {
                // user passed a category-specific log level, i.e. -loglevel=<category>:<level>
                const auto& toks = SplitString(level_str, ':');
                if (!(toks.size() == 2 && LogInstance().SetCategoryLogLevel(toks[0], toks[1]))) {
                    return util::Error{strprintf(_("Unsupported category-specific logging level %1$s=%2$s. Expected %1$s=<category>:<loglevel>. Valid categories: %3$s. Valid loglevels: %4$s."), "-loglevel", level_str, LogInstance().LogCategoriesString(), LogInstance().LogLevelsString())};
                }
            }
        }
    }
    return {};
}